

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QtPrivate::QPropertyBindingData_const*>::
emplace_back_impl<QtPrivate::QPropertyBindingData_const*>
          (QVLABase<const_QtPrivate::QPropertyBindingData_*> *this,qsizetype prealloc,void *array,
          QPropertyBindingData **args)

{
  QVLABase<const_QtPrivate::QPropertyBindingData_*> *this_00;
  QVLABase<const_QtPrivate::QPropertyBindingData_*> *pQVar1;
  iterator ptr;
  QPropertyBindingData **ppQVar2;
  QPropertyBindingData **in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<const_QtPrivate::QPropertyBindingData_*> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<const_QtPrivate::QPropertyBindingData_*> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    QVLABase<const_QtPrivate::QPropertyBindingData_*>::growBy
              ((QVLABase<const_QtPrivate::QPropertyBindingData_*> *)this_01,in_RSI,in_RDX,
               (qsizetype)in_RCX);
  }
  ptr = QVLABase<const_QtPrivate::QPropertyBindingData_*>::end(this_00);
  ppQVar2 = q20::
            construct_at<QtPrivate::QPropertyBindingData_const*,QtPrivate::QPropertyBindingData_const*,void>
                      (ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return ppQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }